

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O3

int mbedtls_ssl_get_ciphersuite_id(char *ciphersuite_name)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  int iVar2;
  mbedtls_ssl_ciphersuite_t *pmVar3;
  
  if (ciphersuite_name != (char *)0x0) {
    pmVar3 = ciphersuite_definitions;
    do {
      iVar2 = strcmp(pmVar3->name,ciphersuite_name);
      if (iVar2 == 0) {
        return pmVar3->id;
      }
      pmVar1 = pmVar3 + 1;
      pmVar3 = pmVar3 + 1;
    } while (pmVar1->id != 0);
  }
  return 0;
}

Assistant:

int mbedtls_ssl_get_ciphersuite_id(const char *ciphersuite_name)
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_string(ciphersuite_name);

    if (cur == NULL) {
        return 0;
    }

    return cur->id;
}